

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# struct_stats.cpp
# Opt level: O1

void duckdb::StructStats::SetChildStats
               (BaseStatistics *stats,idx_t i,
               unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>
               *new_stats)

{
  type other;
  LogicalType *other_00;
  LogicalType LStack_88;
  BaseStatistics local_70;
  
  if ((new_stats->
      super_unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_>)._M_t.
      super___uniq_ptr_impl<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_>.
      _M_t.
      super__Tuple_impl<0UL,_duckdb::BaseStatistics_*,_std::default_delete<duckdb::BaseStatistics>_>
      .super__Head_base<0UL,_duckdb::BaseStatistics_*,_false>._M_head_impl != (BaseStatistics *)0x0)
  {
    other = unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>::
            operator*(new_stats);
    BaseStatistics::Copy
              ((stats->child_stats).
               super_unique_ptr<duckdb::BaseStatistics[],_std::default_delete<duckdb::BaseStatistics[]>_>
               ._M_t.
               super___uniq_ptr_impl<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics[]>_>
               ._M_t.
               super__Tuple_impl<0UL,_duckdb::BaseStatistics_*,_std::default_delete<duckdb::BaseStatistics[]>_>
               .super__Head_base<0UL,_duckdb::BaseStatistics_*,_false>._M_head_impl + i,other);
    return;
  }
  other_00 = StructType::GetChildType(&stats->type,i);
  LogicalType::LogicalType(&LStack_88,other_00);
  BaseStatistics::CreateUnknown(&local_70,&LStack_88);
  BaseStatistics::Copy
            ((stats->child_stats).
             super_unique_ptr<duckdb::BaseStatistics[],_std::default_delete<duckdb::BaseStatistics[]>_>
             ._M_t.
             super___uniq_ptr_impl<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics[]>_>
             ._M_t.
             super__Tuple_impl<0UL,_duckdb::BaseStatistics_*,_std::default_delete<duckdb::BaseStatistics[]>_>
             .super__Head_base<0UL,_duckdb::BaseStatistics_*,_false>._M_head_impl + i,&local_70);
  BaseStatistics::~BaseStatistics(&local_70);
  LogicalType::~LogicalType(&LStack_88);
  return;
}

Assistant:

void StructStats::SetChildStats(BaseStatistics &stats, idx_t i, unique_ptr<BaseStatistics> new_stats) {
	D_ASSERT(stats.GetStatsType() == StatisticsType::STRUCT_STATS);
	if (!new_stats) {
		StructStats::SetChildStats(stats, i,
		                           BaseStatistics::CreateUnknown(StructType::GetChildType(stats.GetType(), i)));
	} else {
		StructStats::SetChildStats(stats, i, *new_stats);
	}
}